

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_gpio_function_in(APITests *this)

{
  int iVar1;
  allocator local_31;
  string local_30;
  
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  iVar1 = GPIO::gpio_function((this->pin_data).in_a);
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  assert::is_true(iVar1 == 2,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  GPIO::cleanup();
  return;
}

Assistant:

void test_gpio_function_in()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        auto val = GPIO::gpio_function(pin_data.in_a);
        assert::is_true(val == GPIO::Directions::IN);
        GPIO::cleanup();
    }